

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O3

uint32 rw::xbox::makeVertexFmt(int32 flags,uint32 numTexSets)

{
  int iVar1;
  uint uVar2;
  uint32 uVar3;
  
  uVar3 = 4;
  if (numTexSets < 4) {
    uVar3 = numTexSets;
  }
  uVar2 = (flags & 0x10U) * 4 + 5;
  if (numTexSets != 0) {
    iVar1 = 0;
    do {
      uVar2 = uVar2 | 0x500 << ((byte)iVar1 & 0x1f);
      iVar1 = iVar1 + 4;
    } while (uVar3 << 2 != iVar1);
  }
  return (flags & 8U) << 0x15 | uVar2;
}

Assistant:

uint32
makeVertexFmt(int32 flags, uint32 numTexSets)
{
	if(numTexSets > 4)
		numTexSets = 4;
	uint32 fmt = 0x5;	// FLOAT3
	if(flags & Geometry::NORMALS)
		fmt |= 0x40;	// NORMPACKED3
	for(uint32 i = 0; i < numTexSets; i++)
		fmt |= 0x500 << i*4;	// FLOAT2
	if(flags & Geometry::PRELIT)
		fmt |= 0x1000000;	// D3DCOLOR
	return fmt;
}